

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_get_comp(int bits_per_pixel,int is_grey,int *is_rgb16)

{
  int *is_rgb16_local;
  int is_grey_local;
  int bits_per_pixel_local;
  
  if (is_rgb16 != (int *)0x0) {
    *is_rgb16 = 0;
  }
  switch(bits_per_pixel) {
  case 8:
    is_grey_local = 1;
    break;
  default:
    is_grey_local = 0;
    break;
  case 0x10:
    if (is_grey != 0) {
      return 2;
    }
  case 0xf:
    if (is_rgb16 != (int *)0x0) {
      *is_rgb16 = 1;
    }
    is_grey_local = 3;
    break;
  case 0x18:
  case 0x20:
    is_grey_local = bits_per_pixel / 8;
  }
  return is_grey_local;
}

Assistant:

static int stbi__tga_get_comp(int bits_per_pixel, int is_grey, int* is_rgb16)
{
   // only RGB or RGBA (incl. 16bit) or grey allowed
   if (is_rgb16) *is_rgb16 = 0;
   switch(bits_per_pixel) {
      case 8:  return STBI_grey;
      case 16: if(is_grey) return STBI_grey_alpha;
               // fallthrough
      case 15: if(is_rgb16) *is_rgb16 = 1;
               return STBI_rgb;
      case 24: // fallthrough
      case 32: return bits_per_pixel/8;
      default: return 0;
   }
}